

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

SpatialAcc * iDynTree::transformTwistEfficient<iDynTree::SpatialAcc>(Transform *op1,SpatialAcc *op2)

{
  VectorFixSize<3U> *this;
  Stride<0,_0> *this_00;
  MatrixFixSize<3U,_3U> *this_01;
  double *dataPtr;
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDX;
  Transform *in_RSI;
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDI;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> R;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> p;
  SpatialAcc *ret;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffeb8;
  PointerArgType in_stack_fffffffffffffec8;
  SpatialVector<iDynTree::SpatialMotionVector> *this_02;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffee0;
  MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffffee8;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff60;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff68;
  
  this_02 = in_RDI;
  SpatialAcc::SpatialAcc((SpatialAcc *)0x752661);
  this = &Transform::getPosition(in_RSI)->super_Vector3;
  this_00 = (Stride<0,_0> *)VectorFixSize<3U>::data(this);
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
             in_stack_fffffffffffffec8,this_00);
  this_01 = &Transform::getRotation(in_RSI)->super_Matrix3x3;
  dataPtr = MatrixFixSize<3U,_3U>::data(this_01);
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
             dataPtr,this_00);
  SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(in_RDX);
  toEigen<3U>((VectorFixSize<3U> *)this_02);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>::
  operator*((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
             *)this_02,
            (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
             *)in_RDI);
  SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(in_RDI);
  toEigen<3U>((VectorFixSize<3U> *)this_02);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_00,
             (DenseBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
              *)in_stack_fffffffffffffeb8);
  SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(in_RDX);
  toEigen<3U>((VectorFixSize<3U> *)this_02);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>::
  operator*((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
             *)this_02,
            (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
             *)in_RDI);
  SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(in_RDI);
  toEigen<3U>((VectorFixSize<3U> *)this_02);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>,0>>
  ::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(in_RDI);
  toEigen<3U>((VectorFixSize<3U> *)this_02);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_00,
             in_stack_fffffffffffffeb8);
  return (SpatialAcc *)this_02;
}

Assistant:

spatialVelType transformTwistEfficient(const Transform& op1, const spatialVelType& op2)
    {
        spatialVelType ret;

        Eigen::Map<const Eigen::Vector3d> p(op1.getPosition().data());
        Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(op1.getRotation().data());

        toEigen(ret.getAngularVec3()) = R*toEigen(op2.getAngularVec3());
        toEigen(ret.getLinearVec3())  = R*toEigen(op2.getLinearVec3()) + p.cross(toEigen(ret.getAngularVec3()));

        return ret;
    }